

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O2

CK_OBJECT_HANDLE __thiscall HandleManager::getObjectHandle(HandleManager *this,CK_VOID_PTR object)

{
  iterator iVar1;
  _Base_ptr p_Var2;
  MutexLocker lock;
  MutexLocker MStack_28;
  CK_VOID_PTR local_18;
  
  local_18 = object;
  MutexLocker::MutexLocker(&MStack_28,this->handlesMutex);
  iVar1 = std::
          _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
          ::find(&(this->objects)._M_t,&local_18);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->objects)._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = (_Base_ptr)0x0;
  }
  else {
    p_Var2 = iVar1._M_node[1]._M_parent;
  }
  MutexLocker::~MutexLocker(&MStack_28);
  return (CK_OBJECT_HANDLE)p_Var2;
}

Assistant:

CK_OBJECT_HANDLE HandleManager::getObjectHandle(CK_VOID_PTR object)
{
	MutexLocker lock(handlesMutex);

	std::map< CK_VOID_PTR, CK_ULONG>::iterator it = objects.find(object);
	if (it == objects.end())
		return CK_INVALID_HANDLE;
	return it->second;
}